

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzskylnsymmat.cpp
# Opt level: O2

void __thiscall
TPZSkylNSymMatrix<std::complex<double>_>::Read
          (TPZSkylNSymMatrix<std::complex<double>_> *this,TPZStream *buf,void *context)

{
  complex<double> *pcVar1;
  long lVar2;
  int64_t i;
  long lVar3;
  complex<double> *pcVar4;
  complex<double> *pcVar5;
  TPZVec<int> skyl2;
  TPZVec<int> skyl;
  int local_5c;
  TPZVec<int> local_58;
  TPZVec<int> local_38;
  
  TPZBaseMatrix::Read((TPZBaseMatrix *)this,buf,context);
  TPZStream::Read<std::complex<double>>(buf,&(this->fStorage).super_TPZVec<std::complex<double>_>);
  TPZStream::Read<std::complex<double>>(buf,&(this->fStorage).super_TPZVec<std::complex<double>_>);
  local_58._vptr_TPZVec._0_4_ = 0;
  TPZVec<int>::TPZVec(&local_38,
                      (this->super_TPZMatrix<std::complex<double>_>).super_TPZBaseMatrix.fRow + 1,
                      (int *)&local_58);
  local_5c = 0;
  TPZVec<int>::TPZVec(&local_58,
                      (this->super_TPZMatrix<std::complex<double>_>).super_TPZBaseMatrix.fRow + 1,
                      &local_5c);
  TPZStream::Read<int>(buf,&local_38);
  TPZStream::Read<int>(buf,&local_58);
  pcVar1 = (complex<double> *)
           (this->super_TPZMatrix<std::complex<double>_>).super_TPZBaseMatrix.fRow;
  pcVar4 = pcVar1;
  pcVar5 = pcVar1;
  if (pcVar1 != (complex<double> *)0x0) {
    pcVar4 = (this->fStorage).super_TPZVec<std::complex<double>_>.fStore;
    pcVar5 = (this->fStorageb).super_TPZVec<std::complex<double>_>.fStore;
  }
  TPZVec<std::complex<double>_*>::Resize(&this->fElem,(int64_t)(pcVar1->_M_value + 1));
  TPZVec<std::complex<double>_*>::Resize
            (&this->fElemb,
             (this->super_TPZMatrix<std::complex<double>_>).super_TPZBaseMatrix.fRow + 1);
  lVar2 = (this->super_TPZMatrix<std::complex<double>_>).super_TPZBaseMatrix.fRow;
  for (lVar3 = 0; lVar3 <= lVar2; lVar3 = lVar3 + 1) {
    (this->fElem).fStore[lVar3] = pcVar4 + local_38.fStore[lVar3];
    (this->fElemb).fStore[lVar3] = pcVar5 + local_58.fStore[lVar3];
  }
  TPZVec<int>::~TPZVec(&local_58);
  TPZVec<int>::~TPZVec(&local_38);
  return;
}

Assistant:

void TPZSkylNSymMatrix<TVar>::Read(TPZStream &buf, void *context )
{
	TPZMatrix<TVar>::Read(buf, context);
	buf.Read( fStorage);
	buf.Read( fStorage);
	TPZVec<int> skyl(this->Rows()+1,0), skyl2(this->Rows()+1,0);
	buf.Read( skyl);
	buf.Read( skyl2);
	TVar *ptr = 0, *ptr2 = 0;
	if (this->Rows()) {
		ptr = &fStorage[0];
		ptr2 = &fStorageb[0];
	}
	fElem.Resize(this->Rows()+1);
	fElemb.Resize(this->Rows()+1);
	for (int64_t i=0; i<this->Rows()+1; i++) {
		fElem[i] = skyl[i] + ptr;
		fElemb[i] = skyl2[i] + ptr2;
	}
}